

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O0

void __thiscall Assimp::ColladaParser::ReadAssetInfo(ColladaParser *this)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  undefined4 extraout_var;
  ai_real extraout_XMM0_Da;
  allocator local_41;
  string local_40;
  char *local_20;
  char *content;
  ColladaParser *pCStack_10;
  int attrIndex;
  ColladaParser *this_local;
  
  pCStack_10 = this;
  uVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xf])();
  if ((uVar2 & 1) == 0) {
    do {
      while( true ) {
        uVar2 = (*this->mReader->_vptr_IIrrXMLReader[2])();
        if ((uVar2 & 1) == 0) {
          return;
        }
        iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
        if (iVar3 != 1) break;
        bVar1 = IsElement(this,"unit");
        if (bVar1) {
          content._4_4_ = TestAttribute(this,"meter");
          if (content._4_4_ == 0xffffffff) {
            this->mUnitSize = 1.0;
          }
          else {
            (*this->mReader->_vptr_IIrrXMLReader[0xc])(this->mReader,(ulong)content._4_4_);
            this->mUnitSize = extraout_XMM0_Da;
          }
          uVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xf])();
          if ((uVar2 & 1) == 0) {
            SkipElement(this);
          }
        }
        else {
          bVar1 = IsElement(this,"up_axis");
          if (bVar1) {
            local_20 = GetTextContent(this);
            iVar3 = strncmp(local_20,"X_UP",4);
            if (iVar3 == 0) {
              this->mUpDirection = UP_X;
            }
            else {
              iVar3 = strncmp(local_20,"Z_UP",4);
              if (iVar3 == 0) {
                this->mUpDirection = UP_Z;
              }
              else {
                this->mUpDirection = UP_Y;
              }
            }
            TestClosing(this,"up_axis");
          }
          else {
            bVar1 = IsElement(this,"contributor");
            if (bVar1) {
              ReadContributorInfo(this);
            }
            else {
              ReadMetaDataItem(this,&this->mAssetMetaData);
            }
          }
        }
      }
      iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
    } while (iVar3 != 2);
    iVar3 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
    iVar3 = strcmp((char *)CONCAT44(extraout_var,iVar3),"asset");
    if (iVar3 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_40,"Expected end of <asset> element.",&local_41)
      ;
      ThrowException(this,&local_40);
    }
  }
  return;
}

Assistant:

void ColladaParser::ReadAssetInfo()
{
    if (mReader->isEmptyElement())
        return;

    while (mReader->read())
    {
        if (mReader->getNodeType() == irr::io::EXN_ELEMENT)
        {
            if (IsElement("unit"))
            {
                // read unit data from the element's attributes
                const int attrIndex = TestAttribute("meter");
                if (attrIndex == -1) {
                    mUnitSize = 1.f;
                }
                else {
                    mUnitSize = mReader->getAttributeValueAsFloat(attrIndex);
                }

                // consume the trailing stuff
                if (!mReader->isEmptyElement())
                    SkipElement();
            }
            else if (IsElement("up_axis"))
            {
                // read content, strip whitespace, compare
                const char* content = GetTextContent();
                if (strncmp(content, "X_UP", 4) == 0)
                    mUpDirection = UP_X;
                else if (strncmp(content, "Z_UP", 4) == 0)
                    mUpDirection = UP_Z;
                else
                    mUpDirection = UP_Y;

                // check element end
                TestClosing("up_axis");
            }
            else if (IsElement("contributor"))
            {
                ReadContributorInfo();
            }
            else
            {
                ReadMetaDataItem(mAssetMetaData);
            }
        }
        else if (mReader->getNodeType() == irr::io::EXN_ELEMENT_END)
        {
            if (strcmp(mReader->getNodeName(), "asset") != 0)
                ThrowException("Expected end of <asset> element.");

            break;
        }
    }
}